

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O3

int libssh2_channel_request_pty_ex
              (LIBSSH2_CHANNEL *channel,char *term,uint term_len,char *modes,uint modes_len,
              int width,int height,int width_px,int height_px)

{
  uchar uVar1;
  libssh2_nonblocking_states lVar2;
  LIBSSH2_SESSION *session;
  int iVar3;
  time_t start_time;
  char *errmsg;
  uchar *local_90;
  uint32_t local_88;
  uint local_84;
  uchar *local_80;
  ulong local_78;
  ulong local_70;
  uchar *local_68;
  time_t local_60;
  ulong local_58;
  char *local_50;
  char *local_48;
  uchar *data;
  size_t local_38;
  
  if (channel == (LIBSSH2_CHANNEL *)0x0) {
    iVar3 = -0x27;
  }
  else {
    local_88 = width;
    local_50 = term;
    local_48 = modes;
    start_time = time((time_t *)0x0);
    local_84 = modes_len + term_len;
    local_58 = (ulong)(modes_len + term_len + 0x29);
    local_68 = channel->reqPTY_packet + 1;
    local_80 = channel->reqPTY_local_channel;
    local_78 = (ulong)modes_len;
    local_70 = (ulong)term_len;
    local_60 = start_time;
    do {
      session = channel->session;
      lVar2 = channel->reqPTY_state;
      if (lVar2 == libssh2_NB_state_sent) {
LAB_0011560c:
        iVar3 = _libssh2_packet_requirev
                          (session,"cd",&data,&local_38,1,local_80,4,
                           &channel->reqPTY_packet_requirev_state);
        if (iVar3 != -0x25) {
          if (iVar3 == 0) {
            uVar1 = *data;
            (*session->free)(data,&session->abstract);
            channel->reqPTY_state = libssh2_NB_state_idle;
            start_time = local_60;
            if (uVar1 == 'c') {
              return 0;
            }
LAB_0011566b:
            iVar3 = -0x16;
            errmsg = "Unable to complete request for channel request-pty";
          }
          else {
            channel->reqPTY_state = libssh2_NB_state_idle;
            iVar3 = -0xe;
            errmsg = "Failed to require the PTY package";
          }
LAB_001156b1:
          iVar3 = _libssh2_error(session,iVar3,errmsg);
        }
        if (iVar3 != -0x25) {
          return iVar3;
        }
      }
      else {
        if (lVar2 != libssh2_NB_state_created) {
          if (lVar2 != libssh2_NB_state_idle) goto LAB_0011566b;
          if (local_84 < 0x101) {
            channel->reqPTY_packet_len = local_58;
            (channel->reqPTY_packet_requirev_state).start = 0;
            local_90 = local_68;
            channel->reqPTY_packet[0] = 'b';
            _libssh2_store_u32(&local_90,(channel->remote).id);
            _libssh2_store_str(&local_90,"pty-req",7);
            *local_90 = '\x01';
            local_90 = local_90 + 1;
            _libssh2_store_str(&local_90,local_50,local_70);
            _libssh2_store_u32(&local_90,local_88);
            _libssh2_store_u32(&local_90,height);
            _libssh2_store_u32(&local_90,width_px);
            _libssh2_store_u32(&local_90,height_px);
            _libssh2_store_str(&local_90,local_48,local_78);
            channel->reqPTY_state = libssh2_NB_state_created;
            goto LAB_001155b3;
          }
          iVar3 = -0x22;
          errmsg = "term + mode lengths too large";
          goto LAB_001156b1;
        }
LAB_001155b3:
        iVar3 = _libssh2_transport_send
                          (session,channel->reqPTY_packet,channel->reqPTY_packet_len,(uchar *)0x0,0)
        ;
        if (iVar3 == 0) {
          _libssh2_htonu32(local_80,(channel->local).id);
          channel->reqPTY_state = libssh2_NB_state_sent;
          goto LAB_0011560c;
        }
        if (iVar3 != -0x25) {
          channel->reqPTY_state = libssh2_NB_state_idle;
          errmsg = "Unable to send pty-request packet";
          goto LAB_001156b1;
        }
        _libssh2_error(session,-0x25,"Would block sending pty request");
      }
      if (channel->session->api_block_mode == 0) {
        return -0x25;
      }
      iVar3 = _libssh2_wait_socket(channel->session,start_time);
    } while (iVar3 == 0);
  }
  return iVar3;
}

Assistant:

LIBSSH2_API int
libssh2_channel_request_pty_ex(LIBSSH2_CHANNEL *channel, const char *term,
                               unsigned int term_len, const char *modes,
                               unsigned int modes_len, int width, int height,
                               int width_px, int height_px)
{
    int rc;

    if(!channel)
        return LIBSSH2_ERROR_BAD_USE;

    BLOCK_ADJUST(rc, channel->session,
                 channel_request_pty(channel, term, term_len, modes,
                                     modes_len, width, height,
                                     width_px, height_px));
    return rc;
}